

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.h
# Opt level: O0

void mempool_free_slab(mempool *pool,mslab *slab,void *ptr)

{
  void *ptr_local;
  mslab *slab_local;
  mempool *pool_local;
  
  if (ptr == (void *)0x0) {
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                  ,0x126,"void mempool_free_slab(struct mempool *, struct mslab *, void *)");
  }
  memset(ptr,0x23,(ulong)pool->objsize);
  if ((slab->slab).order == pool->slab_order) {
    (pool->slabs).stats.used = (pool->slabs).stats.used - (ulong)pool->objsize;
    mslab_free(pool,slab,ptr);
    return;
  }
  __assert_fail("slab->slab.order == pool->slab_order",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                ,0x12a,"void mempool_free_slab(struct mempool *, struct mslab *, void *)");
}

Assistant:

static inline void
mempool_free_slab(struct mempool *pool, struct mslab *slab, void *ptr)
{
	assert(ptr);
#ifndef NDEBUG
	memset(ptr, '#', pool->objsize);
#endif
	assert(slab->slab.order == pool->slab_order);
	pool->slabs.stats.used -= pool->objsize;
	mslab_free(pool, slab, ptr);
}